

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void rsg::ValueRange::computeIntersection
               (ValueRange *dst,ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  ValueRangeAccess dst_00;
  ValueRangeAccess local_38;
  ConstValueRangeAccess *local_20;
  ConstValueRangeAccess *b_local;
  ConstValueRangeAccess *a_local;
  ValueRange *dst_local;
  
  local_20 = b;
  b_local = a;
  a_local = (ConstValueRangeAccess *)dst;
  asAccess(&local_38,dst);
  dst_00.super_ConstValueRangeAccess.m_min = local_38.super_ConstValueRangeAccess.m_min;
  dst_00.super_ConstValueRangeAccess.m_type = local_38.super_ConstValueRangeAccess.m_type;
  dst_00.super_ConstValueRangeAccess.m_max = local_38.super_ConstValueRangeAccess.m_max;
  computeIntersection(dst_00,b_local,local_20);
  return;
}

Assistant:

void ValueRange::computeIntersection (ValueRange& dst, const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	computeIntersection(dst.asAccess(), a, b);
}